

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InvalidateDefaultFramebufferBindCase::render
          (InvalidateDefaultFramebufferBindCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  void *pvVar1;
  int i;
  deUint32 program;
  deUint32 program_00;
  int iVar2;
  int iVar3;
  long lVar4;
  Context *pCVar5;
  int i_1;
  deUint32 *attachments_00;
  ulong uVar6;
  deUint32 tex;
  deUint32 fbo;
  deUint32 local_4bc;
  Vec4 local_4b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  Vec4 local_490;
  Surface *local_480;
  GradientShader gradShader;
  FlatColorShader flatShader;
  Texture2DShader texShader;
  
  fbo = 0;
  tex = 0;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x28;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&gradShader,(iterator)0x0,
             (DataType *)&attachments);
  lVar4 = 0;
  do {
    *(undefined4 *)
     ((long)&attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar4 * 4) = 0x3f800000;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_4b8.m_data[0] = 0.0;
  local_4b8.m_data[1] = 0.0;
  local_4b8.m_data[2] = 0.0;
  local_4b8.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,(DataTypes *)&gradShader,TYPE_FLOAT_VEC4,(Vec4 *)&attachments,&local_4b8);
  if (gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments(&attachments,this->m_buffers);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar5->_vptr_Context[0x75])(pCVar5,&flatShader);
  local_480 = dst;
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4bc = (*pCVar5->_vptr_Context[0x75])(pCVar5,&texShader);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  program_00 = (*pCVar5->_vptr_Context[0x75])(pCVar5,&gradShader);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x8058,iVar2,iVar3,0,0x1908,0x1401,(void *)0x0)
  ;
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,tex,0);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,0);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = 1.0;
  local_4b8.m_data[1] = 0.0;
  local_4b8.m_data[2] = 0.0;
  local_4b8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar5,program,&local_4b8);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = -1.0;
  local_4b8.m_data[1] = -1.0;
  local_4b8.m_data[2] = -1.0;
  local_490.m_data._0_8_ = &DAT_3f8000003f800000;
  local_490.m_data[2] = 1.0;
  sglr::drawQuad(pCVar5,program,(Vec3 *)&local_4b8,(Vec3 *)&local_490);
  uVar6 = (long)attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)CONCAT44(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
  attachments_00 = (deUint32 *)0x0;
  if (uVar6 != 0) {
    attachments_00 =
         (deUint32 *)
         CONCAT44(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                  attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start._0_4_);
  }
  sglr::ContextWrapper::glInvalidateFramebuffer(this_00,0x8d40,(int)(uVar6 >> 2),attachments_00);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glDisable(this_00,0xb90);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = 0.0;
  local_4b8.m_data[1] = 0.0;
  local_4b8.m_data[2] = 0.0;
  local_4b8.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    local_490.m_data[lVar4] = 1.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  FboTestUtil::GradientShader::setGradient(&gradShader,pCVar5,program_00,&local_4b8,&local_490);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = -1.0;
  local_4b8.m_data[1] = -1.0;
  local_4b8.m_data._8_8_ = local_4b8.m_data._8_8_ & 0xffffffff00000000;
  local_490.m_data._0_8_ = &DAT_3f8000003f800000;
  local_490.m_data[2] = 0.0;
  sglr::drawQuad(pCVar5,program_00,(Vec3 *)&local_4b8,(Vec3 *)&local_490);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  if ((this->m_buffers & 0x4000) != 0) {
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_4b8.m_data[0] = 0.0;
    local_4b8.m_data[1] = 1.0;
    local_4b8.m_data[2] = 0.0;
    local_4b8.m_data[3] = 1.0;
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar5,program,&local_4b8);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_4b8.m_data[0] = -1.0;
    local_4b8.m_data[1] = -1.0;
    local_4b8.m_data._8_8_ = local_4b8.m_data._8_8_ & 0xffffffff00000000;
    local_490.m_data._0_8_ = &DAT_3f8000003f800000;
    local_490.m_data[2] = 0.0;
    sglr::drawQuad(pCVar5,program,(Vec3 *)&local_4b8,(Vec3 *)&local_490);
  }
  if ((this->m_buffers & 0x100) != 0) {
    sglr::ContextWrapper::glDepthFunc(this_00,0x207);
  }
  if ((this->m_buffers & 0x400) == 0) {
    sglr::ContextWrapper::glStencilFunc(this_00,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar5,local_4bc);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = -1.0;
  local_4b8.m_data[1] = -1.0;
  local_4b8.m_data._8_8_ = local_4b8.m_data._8_8_ & 0xffffffff00000000;
  local_490.m_data._0_8_ = &DAT_3f8000003f800000;
  local_490.m_data[2] = 0.0;
  sglr::drawQuad(pCVar5,local_4bc,(Vec3 *)&local_4b8,(Vec3 *)&local_490);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&this->super_FboTestCase,local_480,0,0,iVar2,iVar3);
  pvVar1 = (void *)CONCAT44(attachments.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            attachments.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		deUint32			fbo			= 0;
		deUint32			tex			= 0;
		FlatColorShader		flatShader	(glu::TYPE_FLOAT_VEC4);
		Texture2DShader		texShader	(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		GradientShader		gradShader	(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments	= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID= getCurrentContext()->createProgram(&flatShader);
		deUint32			texShaderID = getCurrentContext()->createProgram(&texShader);
		deUint32			gradShaderID= getCurrentContext()->createProgram(&gradShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenFramebuffers		(1, &fbo);
		glGenTextures			(1, &tex);
		glBindTexture			(GL_TEXTURE_2D, tex);
		glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA8, getWidth(), getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		glTexParameteri			(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		glBindTexture			(GL_TEXTURE_2D, 0);
		checkFramebufferStatus	(GL_FRAMEBUFFER);

		glBindFramebuffer		(GL_FRAMEBUFFER, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0]);

		// Switch to fbo and render gradient into it.
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);
		glBindFramebuffer	(GL_FRAMEBUFFER, fbo);

		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore default fbo.
		glBindFramebuffer	(GL_FRAMEBUFFER, 0);

		if ((m_buffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		if ((m_buffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_buffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);
		glBindTexture	(GL_TEXTURE_2D, tex);

		texShader.setUniforms(*getCurrentContext(), texShaderID);
		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}